

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int ly_path_data2schema_subexp
              (ly_ctx *ctx,lys_node *orig_parent,lys_module *cur_mod,lyxp_expr *exp,
              uint16_t *cur_exp,char **out,uint16_t *out_used)

{
  char cVar1;
  ushort uVar2;
  lyxp_token lVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  ushort **ppuVar13;
  bool bVar14;
  lys_node *local_e0;
  lys_node *local_a0;
  int path_lost;
  int first;
  lyxp_token end_token;
  lys_node *parent;
  lys_node *node2;
  lys_node *node;
  char *col;
  char *str;
  uint16_t slash;
  uint16_t len;
  uint16_t k;
  uint16_t j;
  char **out_local;
  uint16_t *cur_exp_local;
  lyxp_expr *exp_local;
  lys_module *cur_mod_local;
  lys_node *orig_parent_local;
  ly_ctx *ctx_local;
  
  col = (char *)0x0;
  path_lost = 0;
  lVar3 = exp->tokens[*cur_exp];
  if (lVar3 == LYXP_TOKEN_PAR1) {
    path_lost = 2;
    iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
    if (iVar6 != 0) {
LAB_0010afb0:
      free(col);
      return -1;
    }
    *cur_exp = *cur_exp + 1;
    bVar14 = false;
  }
  else if (lVar3 == LYXP_TOKEN_BRACK1) {
    path_lost = 4;
    iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
    if (iVar6 != 0) goto LAB_0010afb0;
    *cur_exp = *cur_exp + 1;
    bVar14 = false;
  }
  else if (lVar3 == LYXP_TOKEN_OPERATOR_PATH) {
    bVar14 = orig_parent == (lys_node *)0x0;
  }
  else {
    bVar14 = true;
  }
  bVar4 = false;
  _first = orig_parent;
  exp_local = (lyxp_expr *)cur_mod;
  do {
    col = (char *)0x0;
    if (exp->used <= *cur_exp) {
      if (path_lost == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
        ctx_local._4_4_ = -1;
      }
      return ctx_local._4_4_;
    }
    switch(exp->tokens[*cur_exp]) {
    case LYXP_TOKEN_PAR1:
    case LYXP_TOKEN_BRACK1:
      iVar6 = ly_path_data2schema_subexp
                        (ctx,_first,(lys_module *)exp_local,exp,cur_exp,out,out_used);
      break;
    default:
      if ((path_lost == 0) || (exp->tokens[*cur_exp] != path_lost)) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid token used (%.*s).",(ulong)exp->tok_len[*cur_exp],
               exp->expr + (int)(uint)exp->expr_pos[*cur_exp]);
      }
      else {
        iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
        if (iVar6 == 0) {
          return 0;
        }
      }
      goto LAB_0010afb0;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_NAMETEST:
      if (bVar4) {
        iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
        break;
      }
      col = strndup(exp->expr + (int)(uint)exp->expr_pos[*cur_exp],(ulong)exp->tok_len[*cur_exp]);
      if ((lys_node *)col == (lys_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_data2schema_subexp")
        ;
        goto LAB_0010afb0;
      }
      node = (lys_node *)strchr(col,0x3a);
      if (node != (lys_node *)0x0) {
        *(char *)&node->name = '\0';
        node = (lys_node *)((long)&node->name + 1);
      }
      if (bVar14) {
        if (node == (lys_node *)0x0) {
          ly_vlog(ctx,LYE_PATH_MISSMOD,LY_VLOG_NONE,(void *)0x0);
          goto LAB_0010afb0;
        }
        exp_local = (lyxp_expr *)ly_ctx_get_module(ctx,col,(char *)0x0,0);
        if ((lys_module *)exp_local == (lys_module *)0x0) {
          ly_vlog(ctx,LYE_PATH_INMOD,LY_VLOG_STR,col);
          goto LAB_0010afb0;
        }
        bVar14 = false;
      }
      if (node == (lys_node *)0x0) {
        cVar1 = *(char *)&((lys_node *)col)->name;
      }
      else {
        cVar1 = *(char *)&node->name;
      }
      if (cVar1 == '.') {
LAB_0010a875:
        free(col);
        col = (char *)0x0;
        if (path_lost == 0) {
          bVar4 = true;
          iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
          break;
        }
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid path used (%s in a subexpression).",0);
      }
      else {
        if (node == (lys_node *)0x0) {
          cVar1 = *(char *)&((lys_node *)col)->name;
        }
        else {
          cVar1 = *(char *)&node->name;
        }
        if (cVar1 == '*') goto LAB_0010a875;
        node2 = (lys_node *)0x0;
LAB_0010a8eb:
        do {
          do {
            node2 = lys_getnext(node2,_first,(lys_module *)exp_local,0x100);
            if (node2 == (lys_node *)0x0) goto LAB_0010aca3;
            local_a0 = (lys_node *)col;
            if (node != (lys_node *)0x0) {
              local_a0 = node;
            }
            iVar6 = strcmp(node2->name,(char *)local_a0);
          } while (iVar6 != 0);
          if (node != (lys_node *)0x0) {
            plVar7 = lys_node_module(node2);
            iVar6 = strcmp(plVar7->name,col);
            if (iVar6 != 0) goto LAB_0010a8eb;
          }
          if (node != (lys_node *)0x0) break;
          plVar7 = lys_node_module(node2);
          plVar8 = lys_node_module(_first);
        } while (plVar7 != plVar8);
        str._6_2_ = 0;
        parent = node2;
        while (parent != _first) {
          parent = lys_parent(parent);
          if ((parent == (lys_node *)0x0) || (parent->nodetype != LYS_USES)) {
            str._6_2_ = str._6_2_ + 1;
          }
        }
        str._0_2_ = 0;
        for (; str._6_2_ != 0; str._6_2_ = str._6_2_ + -1) {
          str._4_2_ = str._6_2_ + -1;
          parent = node2;
          while (str._4_2_ != 0) {
            parent = lys_parent(parent);
            if (parent == (lys_node *)0x0) {
              __assert_fail("node2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/common.c"
                            ,0x43b,
                            "int ly_path_data2schema_subexp(const struct ly_ctx *, const struct lys_node *, const struct lys_module *, struct lyxp_expr *, uint16_t *, char **, uint16_t *)"
                           );
            }
            if (parent->nodetype != LYS_USES) {
              str._4_2_ = str._4_2_ + -1;
            }
          }
          plVar7 = lys_node_module(parent);
          if ((plVar7 == (lys_module *)exp_local) && (_first != (lys_node *)0x0)) {
            sVar9 = strlen(parent->name);
            uVar5 = (short)str + (short)sVar9;
            pcVar11 = (char *)ly_realloc(*out,(long)(int)((uint)*out_used + (uint)uVar5));
            *out = pcVar11;
            if (*out == (char *)0x0) {
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "ly_path_data2schema_subexp");
              goto LAB_0010afb0;
            }
            pcVar11 = "";
            if ((short)str != 0) {
              pcVar11 = "/";
            }
            sprintf(*out + (long)(int)(uint)*out_used + -1,"%s%s",pcVar11,parent->name);
            *out_used = *out_used + uVar5;
          }
          else {
            plVar7 = lys_node_module(parent);
            sVar9 = strlen(plVar7->name);
            sVar10 = strlen(parent->name);
            uVar5 = (short)str + (short)sVar9 + 1 + (short)sVar10;
            pcVar11 = (char *)ly_realloc(*out,(long)(int)((uint)*out_used + (uint)uVar5));
            *out = pcVar11;
            if (*out == (char *)0x0) {
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "ly_path_data2schema_subexp");
              goto LAB_0010afb0;
            }
            pcVar11 = *out;
            uVar2 = *out_used;
            pcVar12 = "";
            if ((short)str != 0) {
              pcVar12 = "/";
            }
            plVar7 = lys_node_module(parent);
            sprintf(pcVar11 + (long)(int)(uint)uVar2 + -1,"%s%s:%s",pcVar12,plVar7->name,
                    parent->name);
            *out_used = *out_used + uVar5;
          }
          str._0_2_ = 1;
        }
LAB_0010aca3:
        if (node2 != (lys_node *)0x0) {
          str._2_2_ = 0;
          while (ppuVar13 = __ctype_b_loc(),
                ((*ppuVar13)
                 [(int)exp->expr[(int)((uint)exp->expr_pos[*cur_exp] + (uint)exp->tok_len[*cur_exp]
                                      + (uint)str._2_2_)]] & 0x2000) != 0) {
            str._2_2_ = str._2_2_ + 1;
          }
          if (str._2_2_ != 0) {
            pcVar11 = (char *)ly_realloc(*out,(long)(int)((uint)*out_used + (uint)str._2_2_));
            *out = pcVar11;
            if (*out == (char *)0x0) {
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "ly_path_data2schema_subexp");
              goto LAB_0010afb0;
            }
            sprintf(*out + (long)(int)(uint)*out_used + -1,"%*s",(ulong)str._2_2_," ");
            *out_used = *out_used + str._2_2_;
          }
          free(col);
          _first = node2;
          goto LAB_0010af6f;
        }
        local_e0 = (lys_node *)col;
        if (node != (lys_node *)0x0) {
          local_e0 = node;
        }
        ly_vlog(ctx,LYE_PATH_INNODE,LY_VLOG_STR,local_e0);
      }
      goto LAB_0010afb0;
    case LYXP_TOKEN_COMMA:
    case LYXP_TOKEN_OPERATOR_LOG:
    case LYXP_TOKEN_OPERATOR_COMP:
    case LYXP_TOKEN_OPERATOR_MATH:
    case LYXP_TOKEN_OPERATOR_UNI:
      bVar14 = true;
      bVar4 = false;
      _first = orig_parent;
    case LYXP_TOKEN_OPERATOR_PATH:
      if ((exp->tokens[*cur_exp] == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[*cur_exp] == 2)) {
        bVar4 = true;
      }
    case LYXP_TOKEN_NODETYPE:
    case LYXP_TOKEN_FUNCNAME:
    case LYXP_TOKEN_LITERAL:
    case LYXP_TOKEN_NUMBER:
      iVar6 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
    }
    col = (char *)0x0;
    if (iVar6 != 0) goto LAB_0010afb0;
LAB_0010af6f:
    *cur_exp = *cur_exp + 1;
  } while( true );
}

Assistant:

static int
ly_path_data2schema_subexp(const struct ly_ctx *ctx, const struct lys_node *orig_parent, const struct lys_module *cur_mod,
                           struct lyxp_expr *exp, uint16_t *cur_exp, char **out, uint16_t *out_used)
{
    uint16_t j, k, len, slash;
    char *str = NULL, *col;
    const struct lys_node *node, *node2, *parent;
    enum lyxp_token end_token = 0;
    int first, path_lost;

    switch (exp->tokens[*cur_exp]) {
    case LYXP_TOKEN_BRACK1:
        end_token = LYXP_TOKEN_BRACK2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_PAR1:
        end_token = LYXP_TOKEN_PAR2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        first = (orig_parent) ? 0 : 1;
        break;
    default:
        first = 1;
        break;
    }

    path_lost = 0;
    parent = orig_parent;
    while (*cur_exp < exp->used) {
        switch (exp->tokens[*cur_exp]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_NAMETEST:
            if (path_lost) {
                /* we do not know anything anymore, just copy it */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            str = strndup(exp->expr + exp->expr_pos[*cur_exp], exp->tok_len[*cur_exp]);
            LY_CHECK_ERR_GOTO(!str, LOGMEM(ctx), error);

            col = strchr(str, ':');
            if (col) {
                *col = '\0';
                ++col;
            }

            /* first node */
            if (first) {
                if (!col) {
                    LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_NONE, NULL);
                    goto error;
                }

                cur_mod = ly_ctx_get_module(ctx, str, NULL, 0);
                if (!cur_mod) {
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    goto error;
                }

                first = 0;
            }

            if (((col ? col[0] : str[0]) == '.') || ((col ? col[0] : str[0]) == '*')) {
                free(str);
                str = NULL;

                if (end_token) {
                    LOGERR(ctx, LY_EINVAL, "Invalid path used (%s in a subexpression).", str);
                    goto error;
                }

                /* we can no longer evaluate the path, so just copy the rest */
                path_lost = 1;
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            /* create schema path for this data node */
            node = NULL;
            while ((node = lys_getnext(node, parent, cur_mod, LYS_GETNEXT_NOSTATECHECK))) {
                if (strcmp(node->name, col ? col : str)) {
                    continue;
                }

                if (col && strcmp(lys_node_module(node)->name, str)) {
                    continue;
                }
                if (!col && (lys_node_module(node) != lys_node_module(parent))) {
                    continue;
                }

                /* determine how deep the node actually is, we must generate the path from the highest parent */
                j = 0;
                node2 = node;
                while (node2 != parent) {
                    node2 = lys_parent(node2);
                    if (!node2 || (node2->nodetype != LYS_USES)) {
                        ++j;
                    }
                }

                /* first node, do not print '/' */
                slash = 0;
                while (j) {
                    k = j - 1;
                    node2 = node;
                    while (k) {
                        node2 = lys_parent(node2);
                        assert(node2);
                        if (node2->nodetype != LYS_USES) {
                            --k;
                        }
                    }

                    if ((lys_node_module(node2) != cur_mod) || !parent) {
                        /* module name and node name */
                        len = slash + strlen(lys_node_module(node2)->name) + 1 + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s:%s", slash ? "/" : "", lys_node_module(node2)->name, node2->name);
                        *out_used += len;
                    } else {
                        /* only node name */
                        len = slash + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s", slash ? "/" : "", node2->name);
                        *out_used += len;
                    }

                    slash = 1;
                    --j;
                }

                break;
            }
            if (!node) {
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, col ? col : str);
                goto error;
            }

            /* copy any whitespaces */
            for (len = 0; isspace(exp->expr[exp->expr_pos[*cur_exp] + exp->tok_len[*cur_exp] + len]); ++len);
            if (len) {
                *out = ly_realloc(*out, *out_used + len);
                LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                sprintf(*out + *out_used - 1, "%*s", len, " ");
                *out_used += len;
            }

            /* next iteration */
            free(str);
            str = NULL;
            parent = node;
            break;
        case LYXP_TOKEN_COMMA:
        case LYXP_TOKEN_OPERATOR_LOG:
        case LYXP_TOKEN_OPERATOR_COMP:
        case LYXP_TOKEN_OPERATOR_MATH:
        case LYXP_TOKEN_OPERATOR_UNI:
            /* reset the processing */
            first = 1;
            path_lost = 0;
            parent = orig_parent;

            /* fallthrough */
        case LYXP_TOKEN_OPERATOR_PATH:
            if ((exp->tokens[*cur_exp] == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[*cur_exp] == 2)) {
                /* we can no longer evaluate the path further */
                path_lost = 1;
            }
            /* fallthrough */
        case LYXP_TOKEN_NODETYPE:
        case LYXP_TOKEN_FUNCNAME:
        case LYXP_TOKEN_LITERAL:
        case LYXP_TOKEN_NUMBER:
            /* just copy it */
            if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                goto error;
            }
            break;
        case LYXP_TOKEN_BRACK1:
        case LYXP_TOKEN_PAR1:
            if (ly_path_data2schema_subexp(ctx, parent, cur_mod, exp, cur_exp, out, out_used)) {
                goto error;
            }
            break;
        default:
            if (end_token && (exp->tokens[*cur_exp] == end_token)) {
                /* we are done (with this subexpression) */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }

                return 0;
            }
            LOGERR(ctx, LY_EINVAL, "Invalid token used (%.*s).", exp->tok_len[*cur_exp], exp->expr + exp->expr_pos[*cur_exp]);
            goto error;
        }

        ++(*cur_exp);
    }

    if (end_token) {
        LOGVAL(ctx, LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        return -1;
    }

    return 0;

error:
    free(str);
    return -1;
}